

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O2

void __thiscall QPDF::stopOnError(QPDF *this,string *message)

{
  QPDFExc *__return_storage_ptr__;
  allocator<char> local_41;
  string local_40;
  
  __return_storage_ptr__ = (QPDFExc *)__cxa_allocate_exception(0x80);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_41);
  damagedPDF(__return_storage_ptr__,this,&local_40,message);
  __cxa_throw(__return_storage_ptr__,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
}

Assistant:

void
QPDF::stopOnError(std::string const& message)
{
    throw damagedPDF("", message);
}